

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

void __thiscall Loop::SetImplicitCallFlags(Loop *this,ImplicitCallFlags newFlags)

{
  code *pcVar1;
  bool bVar2;
  Loop *pLVar3;
  undefined4 *puVar4;
  
  pLVar3 = this;
  do {
    if ((newFlags & ~pLVar3->implicitCallFlags) == ImplicitCall_HasNoInfo) {
      pLVar3 = pLVar3->parent;
      if (pLVar3 == (Loop *)0x0) {
        return;
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        if ((newFlags & ~pLVar3->implicitCallFlags) != ImplicitCall_HasNoInfo) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0xdf2,"((current->implicitCallFlags & newFlags) == newFlags)",
                             "(current->implicitCallFlags & newFlags) == newFlags");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar4 = 0;
        }
        pLVar3 = pLVar3->parent;
      } while (pLVar3 != (Loop *)0x0);
      return;
    }
    newFlags = newFlags | this->implicitCallFlags;
    pLVar3->implicitCallFlags = newFlags;
    pLVar3 = pLVar3->parent;
  } while (pLVar3 != (Loop *)0x0);
  return;
}

Assistant:

void
Loop::SetImplicitCallFlags(Js::ImplicitCallFlags newFlags)
{
    Loop * current = this;
    do
    {
        if ((current->implicitCallFlags & newFlags) == newFlags)
        {
#if DBG
            current = current->parent;
            while (current)
            {
                Assert((current->implicitCallFlags & newFlags) == newFlags);
                current = current->parent;
            }
#endif
            break;
        }
        newFlags = (Js::ImplicitCallFlags)(implicitCallFlags | newFlags);
        current->implicitCallFlags = newFlags;
        current = current->parent;
    }
    while (current != nullptr);
}